

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PNativeStruct * NewNativeStruct(FName *name,PTypeBase *outer)

{
  PType *type;
  size_t bucket;
  size_t local_28;
  FName local_1c;
  
  type = FTypeTable::FindType
                   (&TypeTable,PNativeStruct::RegistrationInfo.MyClass,(intptr_t)outer,
                    (long)name->Index,&local_28);
  if (type == (PType *)0x0) {
    type = (PType *)M_Malloc_Dbg(0xc0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
    local_1c = (FName)name->Index;
    PNativeStruct::PNativeStruct((PNativeStruct *)type,&local_1c);
    FTypeTable::AddType(&TypeTable,type,PNativeStruct::RegistrationInfo.MyClass,(intptr_t)outer,
                        (long)name->Index,local_28);
  }
  return (PNativeStruct *)type;
}

Assistant:

PNativeStruct *NewNativeStruct(FName name, PTypeBase *outer)
{
	size_t bucket;
	PType *stype = TypeTable.FindType(RUNTIME_CLASS(PNativeStruct), (intptr_t)outer, (intptr_t)name, &bucket);
	if (stype == NULL)
	{
		stype = new PNativeStruct(name);
		TypeTable.AddType(stype, RUNTIME_CLASS(PNativeStruct), (intptr_t)outer, (intptr_t)name, bucket);
	}
	return static_cast<PNativeStruct *>(stype);
}